

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigFeed.c
# Opt level: O2

int * Fraig_ManSaveCounterExample(Fraig_Man_t *p,Fraig_Node_t *pNode)

{
  Fraig_NodeVec_t *pFVar1;
  uint uVar2;
  int iVar3;
  int *pModel;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  
  uVar6 = ~(uint)pNode & 1;
  pModel = Fraig_ManAllocCounterExample(p);
  uVar2 = Fraig_FindFirstDiff(p->pConst1,(Fraig_Node_t *)((ulong)pNode & 0xfffffffffffffffe),uVar6,
                              p->nWordsRand,1);
  if ((int)uVar2 < 0) {
    uVar4 = 0;
    uVar2 = Fraig_FindFirstDiff(p->pConst1,(Fraig_Node_t *)((ulong)pNode & 0xfffffffffffffffe),uVar6
                                ,p->iWordStart,0);
    if ((int)uVar2 < 0) {
      free(pModel);
      pModel = (int *)0x0;
    }
    else {
      pFVar1 = p->vInputs;
      uVar6 = pFVar1->nSize;
      uVar5 = (ulong)uVar6;
      if ((int)uVar6 < 1) {
        uVar5 = uVar4;
      }
      for (; uVar5 != uVar4; uVar4 = uVar4 + 1) {
        if ((pFVar1->pArray[uVar4]->puSimD[uVar2 >> 5] & 1 << ((byte)uVar2 & 0x1f)) != 0) {
          pModel[uVar4] = 1;
        }
      }
      iVar3 = Fraig_ManSimulateBitNode(p,pNode,pModel);
      if (iVar3 == 0) {
        __assert_fail("Fraig_ManSimulateBitNode( p, pNode, pModel )",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fraig/fraigFeed.c"
                      ,900,"int *Fraig_ManSaveCounterExample(Fraig_Man_t *, Fraig_Node_t *)");
      }
    }
  }
  else {
    pFVar1 = p->vInputs;
    uVar6 = pFVar1->nSize;
    uVar4 = 0;
    uVar5 = (ulong)uVar6;
    if ((int)uVar6 < 1) {
      uVar5 = 0;
    }
    for (; uVar5 != uVar4; uVar4 = uVar4 + 1) {
      if ((pFVar1->pArray[uVar4]->puSimR[uVar2 >> 5] & 1 << ((byte)uVar2 & 0x1f)) != 0) {
        pModel[uVar4] = 1;
      }
    }
    iVar3 = Fraig_ManSimulateBitNode(p,pNode,pModel);
    if (iVar3 == 0) {
      __assert_fail("Fraig_ManSimulateBitNode( p, pNode, pModel )",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fraig/fraigFeed.c"
                    ,0x375,"int *Fraig_ManSaveCounterExample(Fraig_Man_t *, Fraig_Node_t *)");
    }
  }
  return pModel;
}

Assistant:

int * Fraig_ManSaveCounterExample( Fraig_Man_t * p, Fraig_Node_t * pNode )
{
    int * pModel;
    int iPattern;
    int i, fCompl;

    // the node can be complemented
    fCompl = Fraig_IsComplement(pNode);
    // because we compare with constant 0, p->pConst1 should also be complemented
    fCompl = !fCompl;

    // derive the model
    pModel = Fraig_ManAllocCounterExample( p );
    iPattern = Fraig_FindFirstDiff( p->pConst1, Fraig_Regular(pNode), fCompl, p->nWordsRand, 1 );
    if ( iPattern >= 0 )
    {
        for ( i = 0; i < p->vInputs->nSize; i++ )
            if ( Fraig_BitStringHasBit( p->vInputs->pArray[i]->puSimR, iPattern ) )
                pModel[i] = 1;
/*
printf( "SAT solver's pattern:\n" );
for ( i = 0; i < p->vInputs->nSize; i++ )
    printf( "%d", pModel[i] );
printf( "\n" );
*/
        assert( Fraig_ManSimulateBitNode( p, pNode, pModel ) );
        return pModel;
    }
    iPattern = Fraig_FindFirstDiff( p->pConst1, Fraig_Regular(pNode), fCompl, p->iWordStart, 0 );
    if ( iPattern >= 0 )
    {
        for ( i = 0; i < p->vInputs->nSize; i++ )
            if ( Fraig_BitStringHasBit( p->vInputs->pArray[i]->puSimD, iPattern ) )
                pModel[i] = 1;
/*
printf( "SAT solver's pattern:\n" );
for ( i = 0; i < p->vInputs->nSize; i++ )
    printf( "%d", pModel[i] );
printf( "\n" );
*/
        assert( Fraig_ManSimulateBitNode( p, pNode, pModel ) );
        return pModel;
    }
    ABC_FREE( pModel );
    return NULL;
}